

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O3

void TR_Cond(ast *node,C_OP *lt,C_OP *lf)

{
  bool bVar1;
  int kind;
  IrSim *this;
  ast *paVar2;
  size_type *psVar3;
  InterCode *lt_00;
  InterCode *__return_storage_ptr__;
  Operand t1;
  Operand t2;
  Operand label1;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  int local_198;
  undefined1 local_190 [8];
  _Alloc_hider local_188;
  _Alloc_hider local_180;
  char local_178 [8];
  size_type local_170 [4];
  _Alloc_hider local_150;
  char local_140 [32];
  _Alloc_hider local_120;
  char local_110 [24];
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  int local_d0;
  InterCode local_c8;
  
  bVar1 = false;
  local_1c0._0_4_ = 0;
  local_1b8._M_p = (pointer)&local_1a8;
  local_1b0 = 0;
  local_1a8._M_local_buf[0] = '\0';
  local_198 = -1;
  local_f0._M_p = (pointer)&local_e0;
  local_f8._0_4_ = 0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_d0 = -1;
  switch(node->type) {
  case 0x107:
    IrSim::newTmpVar((Operand *)local_190,&irSim);
    local_1c0._0_4_ = local_190._0_4_;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_188);
    local_198 = (undefined4)local_170[1];
    if (local_188._M_p != local_178) {
      operator_delete(local_188._M_p);
    }
    IrSim::newTmpVar((Operand *)local_190,&irSim);
    local_f8._0_4_ = local_190._0_4_;
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_188);
    local_d0 = (undefined4)local_170[1];
    if (local_188._M_p != local_178) {
      operator_delete(local_188._M_p);
    }
    paVar2 = sibling(node,-1);
    TR_Exp(paVar2,(C_OP *)local_1c0);
    this = (IrSim *)sibling(node,1);
    TR_Exp((ast *)this,(C_OP *)local_f8);
    kind = IrSim::ast2ic(this,node);
    IrSim::icBinOp((InterCode *)local_190,&irSim,kind,lt,(C_OP *)local_1c0,(C_OP *)local_f8);
    IrSim::commitIc(&irSim,(C_IC *)local_190);
    IrSim::icNoOp(&local_c8,&irSim,0xe,lf);
    IrSim::commitIc(&irSim,&local_c8);
    break;
  default:
    IrSim::newTmpVar((Operand *)local_190,&irSim);
    local_1c0._0_4_ = local_190._0_4_;
    std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_188);
    local_198 = (undefined4)local_170[1];
    if (local_188._M_p != local_178) {
      operator_delete(local_188._M_p);
    }
    TR_Exp(node,(C_OP *)local_1c0);
    IrSim::icBinOp((InterCode *)local_190,&irSim,0x15,lt,(C_OP *)local_1c0,&OP_ZERO);
    IrSim::commitIc(&irSim,(C_IC *)local_190);
    IrSim::icNoOp(&local_c8,&irSim,0xe,lf);
    IrSim::commitIc(&irSim,&local_c8);
    break;
  case 0x10c:
    bVar1 = true;
  case 0x10d:
    __return_storage_ptr__ = &local_c8;
    IrSim::newLabel((Operand *)__return_storage_ptr__,&irSim);
    if (bVar1) {
      paVar2 = sibling(node,-1);
      lt_00 = &local_c8;
      __return_storage_ptr__ = (InterCode *)lf;
    }
    else {
      paVar2 = sibling(node,-1);
      lt_00 = (InterCode *)lt;
    }
    TR_Cond(paVar2,(C_OP *)lt_00,(C_OP *)__return_storage_ptr__);
    IrSim::icNoOp((InterCode *)local_190,&irSim,0x10,(C_OP *)&local_c8);
    IrSim::commitIc(&irSim,(C_IC *)local_190);
    if (local_120._M_p != local_110) {
      operator_delete(local_120._M_p);
    }
    if (local_150._M_p != local_140) {
      operator_delete(local_150._M_p);
    }
    if ((size_type *)local_180._M_p != local_170) {
      operator_delete(local_180._M_p);
    }
    paVar2 = sibling(node,1);
    TR_Cond(paVar2,lt,lf);
    psVar3 = &local_c8.target.value._M_string_length;
    goto LAB_0010c7b6;
  case 0x10f:
    paVar2 = sibling(node,1);
    TR_Cond(paVar2,lf,lt);
    goto LAB_0010c7c4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.arg2.value._M_dataplus._M_p != &local_c8.arg2.value.field_2) {
    operator_delete(local_c8.arg2.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.arg1.value._M_dataplus._M_p != &local_c8.arg1.value.field_2) {
    operator_delete(local_c8.arg1.value._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.target.value._M_dataplus._M_p != &local_c8.target.value.field_2) {
    operator_delete(local_c8.target.value._M_dataplus._M_p);
  }
  if (local_120._M_p != local_110) {
    operator_delete(local_120._M_p);
  }
  if (local_150._M_p != local_140) {
    operator_delete(local_150._M_p);
  }
  psVar3 = local_170;
LAB_0010c7b6:
  if ((size_type *)psVar3[-2] != psVar3) {
    operator_delete((size_type *)psVar3[-2]);
  }
LAB_0010c7c4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p);
  }
  return;
}

Assistant:

static void TR_Cond(ast *node, C_OP &lt, C_OP &lf) {
    Operand t1, t2;
    switch (node->type) {
        case NOT:
            TR_Cond(sibling(node, 1), lf, lt);
            break;
        case OR: // no break
            TR_AND_OR(node, lt, lf, false);
            break;
        case AND:
            TR_AND_OR(node, lt, lf, true);
            break;
        case RELOP:
            t1 = irSim.newTmpVar();
            t2 = irSim.newTmpVar();
            TR_Exp(sibling(node, -1), t1);
            TR_Exp(sibling(node, 1), t2);
            irSim << irSim.icIfGoto(node, lt, t1, t2) << irSim.icGoto(lf);
            break;
        default:
            t1 = irSim.newTmpVar();
            TR_Exp(node, t1);
            irSim << irSim.icIfGoto(IC_NE, lt, t1, OP_ZERO) << irSim.icGoto(lf);
    }
}